

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O0

OLECHAR __thiscall
UTF8EncodingPolicyBase<false>::ReadSurrogatePairUpper
          (UTF8EncodingPolicyBase<false> *this,EncodedCharPtr *p,EncodedCharPtr last)

{
  byte bVar1;
  byte *pbVar2;
  code *pcVar3;
  bool bVar4;
  OLECHAR OVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  EncodedChar ch;
  EncodedCharPtr last_local;
  EncodedCharPtr *p_local;
  UTF8EncodingPolicyBase<false> *this_local;
  
  if (*p < last) {
    pbVar2 = *p;
    *p = pbVar2 + 1;
    bVar1 = *pbVar2;
  }
  else {
    *p = *p + 1;
    bVar1 = 0;
  }
  BVar6 = IsMultiUnitChar((ushort)bVar1);
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.h"
                       ,0xea,"(IsMultiUnitChar(ch))","IsMultiUnitChar(ch)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  utf8::operator|=(&this->m_decodeOptions,doSecondSurrogatePair);
  OVar5 = ReadRest<true>(this,(ushort)bVar1,p,last);
  return OVar5;
}

Assistant:

OLECHAR ReadSurrogatePairUpper(EncodedCharPtr &p, EncodedCharPtr last)
    {
        EncodedChar ch = (nullTerminated || p < last) ? *p++ : (p++, 0);
        Assert(IsMultiUnitChar(ch));
        this->m_decodeOptions |= utf8::DecodeOptions::doSecondSurrogatePair;
        return ReadRest<true>(ch, p, last);
    }